

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_server_socket.c
# Opt level: O2

void test_accept_bind_address(void)

{
  cio_address_family family;
  cio_error cVar1;
  cio_server_socket ss;
  cio_socket_address endpoint;
  cio_eventloop loop;
  
  accept4_fake.custom_fake = custom_accept_fake;
  accept_handler_fake.custom_fake = accept_handler_close_server_socket;
  alloc_client_fake.custom_fake = alloc_success;
  free_client_fake.custom_fake = free_success;
  fill_inet_socket_address(&endpoint);
  family = cio_socket_address_get_family(&endpoint);
  cVar1 = cio_server_socket_init(&ss,&loop,5,family,alloc_client,free_client,10,on_close);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x14b,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_set_reuse_address(&ss,true);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x14d,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_bind(&ss,&endpoint);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x150,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_accept(&ss,accept_handler,(void *)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x153,UNITY_DISPLAY_STYLE_INT);
  (*ss.impl.ev.read_callback)(ss.impl.ev.context,CIO_EPOLL_SUCCESS);
  UnityAssertEqualNumber
            (1,(ulong)accept_handler_fake.call_count,(char *)0x0,0x157,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)on_close_fake.call_count,(char *)0x0,0x158,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&ss,(UNITY_INT)on_close_fake.arg0_val,(char *)0x0,0x159,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_accept_bind_address(void)
{
	accept4_fake.custom_fake = custom_accept_fake;
	accept_handler_fake.custom_fake = accept_handler_close_server_socket;
	alloc_client_fake.custom_fake = alloc_success;
	free_client_fake.custom_fake = free_success;

	struct cio_socket_address endpoint;
	fill_inet_socket_address(&endpoint);

	struct cio_eventloop loop;
	struct cio_server_socket ss;
	enum cio_error err = cio_server_socket_init(&ss, &loop, 5, cio_socket_address_get_family(&endpoint), alloc_client, free_client, 10, on_close);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);
	err = cio_server_socket_set_reuse_address(&ss, true);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	err = cio_server_socket_bind(&ss, &endpoint);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	err = cio_server_socket_accept(&ss, accept_handler, NULL);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	ss.impl.ev.read_callback(ss.impl.ev.context, CIO_EPOLL_SUCCESS);

	TEST_ASSERT_EQUAL(1, accept_handler_fake.call_count);
	TEST_ASSERT_EQUAL(1, on_close_fake.call_count);
	TEST_ASSERT_EQUAL(&ss, on_close_fake.arg0_val);
}